

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O2

void __thiscall
HACD::MyWuQuantizer::normalizeInput(MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  HaF32 HVar12;
  HaF32 HVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Vec3 local_58;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  (this->mNormalizedInput).mSize = 0;
  (this->mQuantizedOutput).mSize = 0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)vertices;
  HVar12 = vertices[2];
  uVar6 = 1;
  uVar7 = 3;
  auVar5 = auVar10;
  HVar13 = HVar12;
  while( true ) {
    if (vcount <= uVar6) break;
    uVar8 = uVar7 & 0xffffffff;
    fVar9 = (float)vertices[uVar8];
    auVar11 = auVar10;
    auVar15 = ZEXT416((uint)fVar9);
    if ((auVar5._0_4_ <= fVar9) && (auVar15 = auVar5, auVar10._0_4_ < fVar9)) {
      auVar11 = ZEXT416((uint)fVar9);
    }
    fVar9 = (float)vertices[uVar8 + 1];
    auVar5 = vmovshdup_avx(auVar5);
    auVar10 = vmovshdup_avx(auVar10);
    auVar19 = ZEXT416((uint)fVar9);
    if ((auVar5._0_4_ <= fVar9) && (auVar19 = auVar5, auVar10._0_4_ < fVar9)) {
      auVar10 = ZEXT416((uint)fVar9);
    }
    fVar9 = (float)vertices[uVar8 + 2];
    fVar14 = fVar9;
    if (((float)HVar13 <= fVar9) && (fVar14 = (float)HVar13, (float)HVar12 < fVar9)) {
      HVar12 = (HaF32)fVar9;
    }
    uVar6 = uVar6 + 1;
    auVar10 = vinsertps_avx(auVar11,auVar10,0x10);
    auVar5 = vinsertps_avx(auVar15,auVar19,0x10);
    uVar7 = uVar7 + 3;
    HVar13 = (HaF32)fVar14;
  }
  auVar11 = vsubps_avx(auVar10,auVar5);
  uVar7 = 0;
  auVar19._0_4_ = (auVar10._0_4_ + auVar5._0_4_) * 0.5;
  auVar19._4_4_ = (auVar10._4_4_ + auVar5._4_4_) * 0.5;
  auVar19._8_4_ = (auVar10._8_4_ + auVar5._8_4_) * 0.5;
  auVar19._12_4_ = (auVar10._12_4_ + auVar5._12_4_) * 0.5;
  uVar2 = vmovlps_avx(auVar19);
  (this->mCenter).x = (HaF32)(int)uVar2;
  (this->mCenter).y = (HaF32)(int)((ulong)uVar2 >> 0x20);
  uVar6 = vcmpps_avx512vl(auVar11,ZEXT816(0) << 0x40,0);
  auVar5._8_4_ = 0x3f8020c5;
  auVar5._0_8_ = 0x3f8020c53f8020c5;
  auVar5._12_4_ = 0x3f8020c5;
  auVar10 = vmulps_avx512vl(auVar11,auVar5);
  auVar15._8_4_ = 0x3f800000;
  auVar15._0_8_ = 0x3f8000003f800000;
  auVar15._12_4_ = 0x3f800000;
  (this->mCenter).z = (HaF32)(((float)HVar12 + (float)HVar13) * 0.5);
  bVar4 = (bool)((byte)uVar6 & 1);
  auVar11._0_4_ = (uint)bVar4 * 0x3f800000 | (uint)!bVar4 * (int)(auVar10._0_4_ * 0.5);
  bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar11._4_4_ = (uint)bVar4 * 0x3f800000 | (uint)!bVar4 * (int)(auVar10._4_4_ * 0.5);
  bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar11._8_4_ = (uint)bVar4 * 0x3f800000 | (uint)!bVar4 * (int)(auVar10._8_4_ * 0.5);
  bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar11._12_4_ = (uint)bVar4 * 0x3f800000 | (uint)!bVar4 * (int)(auVar10._12_4_ * 0.5);
  uVar2 = vcmpss_avx512f(ZEXT416((uint)((float)HVar12 - (float)HVar13)),ZEXT816(0) << 0x20,0);
  bVar4 = (bool)((byte)uVar2 & 1);
  uVar2 = vmovlps_avx(auVar11);
  (this->mScale).x = (HaF32)(int)uVar2;
  (this->mScale).y = (HaF32)(int)((ulong)uVar2 >> 0x20);
  _local_48 = vdivps_avx(auVar15,auVar11);
  fVar9 = (float)((uint)bVar4 * 0x3f800000 +
                 (uint)!bVar4 * (int)(((float)HVar12 - (float)HVar13) * 1.001 * 0.5));
  (this->mScale).z = (HaF32)fVar9;
  while( true ) {
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    if ((ulong)vcount * 3 == uVar7) {
      return;
    }
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)(vertices + (uVar7 & 0xffffffff));
    uVar1 = (this->mCenter).x;
    uVar3 = (this->mCenter).y;
    auVar18._4_4_ = uVar3;
    auVar18._0_4_ = uVar1;
    auVar18._8_8_ = 0;
    auVar10 = vsubps_avx(auVar16,auVar18);
    auVar17._0_4_ = auVar10._0_4_ * (float)local_48._0_4_;
    auVar17._4_4_ = auVar10._4_4_ * (float)local_48._4_4_;
    auVar17._8_4_ = auVar10._8_4_ * fStack_40;
    auVar17._12_4_ = auVar10._12_4_ * fStack_3c;
    local_58._0_8_ = vmovlps_avx(auVar17);
    auVar10 = vandps_avx(auVar17,auVar20);
    local_58.z = (HaF32)(((float)vertices[(uVar7 & 0xffffffff) + 2] - (float)(this->mCenter).z) *
                        (1.0 / fVar9));
    if (1.0 < auVar10._0_4_) {
      __assert_fail("v.x >= -1 && v.x <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                    ,0x3ef,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
    }
    auVar10 = vmovshdup_avx(auVar17);
    auVar10 = vandps_avx(auVar10,auVar20);
    if (1.0 < auVar10._0_4_) {
      __assert_fail("v.y >= -1 && v.y <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                    ,0x3f0,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
    }
    auVar10 = vandps_avx(ZEXT416((uint)local_58.z),auVar20);
    if (1.0 < auVar10._0_4_) break;
    hacd::vector<HACD::Vec3>::push_back(&this->mNormalizedInput,&local_58);
    uVar7 = uVar7 + 3;
  }
  __assert_fail("v.z >= -1 && v.z <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                ,0x3f1,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
}

Assistant:

void normalizeInput(HaU32 vcount,const HaF32 *vertices)
	{
		mNormalizedInput.clear();
		mQuantizedOutput.clear();
		Vec3 bmin(vertices);
		Vec3 bmax(vertices);
		for (HaU32 i=1; i<vcount; i++)
		{
			Vec3 v(&vertices[i*3]);

			if ( v.x < bmin.x ) 
			{
				bmin.x = v.x;
			}
			else if ( v.x > bmax.x )
			{
				bmax.x = v.x;
			}

			if ( v.y < bmin.y ) 
			{
				bmin.y = v.y;
			}
			else if ( v.y > bmax.y )
			{
				bmax.y = v.y;
			}

			if ( v.z < bmin.z ) 
			{
				bmin.z = v.z;
			}
			else if ( v.z > bmax.z )
			{
				bmax.z = v.z;
			}
		}

		mCenter.x = (bmin.x+bmax.x)*0.5f;
		mCenter.y = (bmin.y+bmax.y)*0.5f;
		mCenter.z = (bmin.z+bmax.z)*0.5f;

		HaF32 dx = bmax.x-bmin.x;
		HaF32 dy = bmax.y-bmin.y;
		HaF32 dz = bmax.z-bmin.z;

		if ( dx == 0 )
		{
			mScale.x = 1;
		}
		else
		{
			dx = dx*1.001f;
			mScale.x = dx*0.5f;
		}
		if ( dy == 0 )
		{
			mScale.y = 1;
		}
		else
		{
			dy = dy*1.001f;
			mScale.y = dy*0.5f;
		}
		if ( dz == 0 )
		{
			mScale.z = 1;
		}
		else
		{
			dz = dz*1.001f;
			mScale.z = dz*0.5f;
		}

		Vec3 recip;
		recip.x = 1.0f / mScale.x;
		recip.y = 1.0f / mScale.y;
		recip.z = 1.0f / mScale.z;

		for (HaU32 i=0; i<vcount; i++)
		{
			Vec3 v(&vertices[i*3]);

			v.x = (v.x-mCenter.x)*recip.x;
			v.y = (v.y-mCenter.y)*recip.y;
			v.z = (v.z-mCenter.z)*recip.z;

			HACD_ASSERT( v.x >= -1 && v.x <= 1 );
			HACD_ASSERT( v.y >= -1 && v.y <= 1 );
			HACD_ASSERT( v.z >= -1 && v.z <= 1 );
			mNormalizedInput.push_back(v);
		}
	}